

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

void vkt::texture::util::calcCubemapFaceCoords
               (Vec3 *r,Vec3 *drdx,Vec3 *drdy,int faceNdx,Vec2 *coordFace,Vec2 *dPdxFace,
               Vec2 *dPdyFace)

{
  float fVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  Vec3 dPcdy;
  Vec3 dPcdx;
  Vector<float,_3> local_54;
  Vector<float,_3> local_48;
  Vector<float,_3> local_3c;
  
  tcu::Vector<float,_3>::Vector(&local_54);
  tcu::Vector<float,_3>::Vector(&local_3c);
  tcu::Vector<float,_3>::Vector(&local_48);
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    fVar4 = (float)*(int *)((long)calcCubemapFaceCoords::signMap[faceNdx] + lVar3);
    iVar2 = *(int *)((long)calcCubemapFaceCoords::compMap[faceNdx] + lVar3);
    *(float *)((long)local_54.m_data + lVar3) = r->m_data[iVar2] * fVar4;
    *(float *)((long)local_3c.m_data + lVar3) = drdx->m_data[iVar2] * fVar4;
    *(float *)((long)local_48.m_data + lVar3) = fVar4 * drdy->m_data[iVar2];
  }
  fVar4 = -local_54.m_data[2];
  if (-local_54.m_data[2] <= local_54.m_data[2]) {
    fVar4 = local_54.m_data[2];
  }
  local_54.m_data[2] = fVar4;
  fVar5 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar5 = fVar4;
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    fVar1 = *(float *)((long)local_54.m_data + lVar3);
    *(float *)((long)coordFace->m_data + lVar3) = (fVar1 * 0.5) / fVar5 + 0.5;
    *(float *)((long)dPdxFace->m_data + lVar3) =
         ((*(float *)((long)local_3c.m_data + lVar3) * fVar5 - local_3c.m_data[2] * fVar1) * 0.5) /
         (fVar4 * fVar4);
    *(float *)((long)dPdyFace->m_data + lVar3) =
         ((*(float *)((long)local_48.m_data + lVar3) * fVar5 - fVar1 * local_48.m_data[2]) * 0.5) /
         (fVar4 * fVar4);
  }
  return;
}

Assistant:

void calcCubemapFaceCoords (const Vec3& r,
							const Vec3& drdx,
							const Vec3& drdy,
							const int	faceNdx,
							Vec2&		coordFace,
							Vec2&		dPdxFace,
							Vec2&		dPdyFace)
{
	DE_ASSERT(faceNdx >= 0 && faceNdx < 6);

	static const int compMap[6][3] =
	{
		{2, 1, 0},
		{2, 1, 0},
		{0, 2, 1},
		{0, 2, 1},
		{0, 1, 2},
		{0, 1, 2}
	};

	static const int signMap[6][3] =
	{
		{-1, -1, +1},
		{+1, -1, -1},
		{+1, +1, +1},
		{+1, -1, -1},
		{+1, -1, +1},
		{-1, -1, -1}
	};

	Vec3 coordC;
	Vec3 dPcdx;
	Vec3 dPcdy;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int	mappedComp = compMap[faceNdx][compNdx];
		const int	mappedSign = signMap[faceNdx][compNdx];

		coordC[compNdx] = r   [mappedComp]	* (float)mappedSign;
		dPcdx [compNdx]	= drdx[mappedComp]	* (float)mappedSign;
		dPcdy [compNdx]	= drdy[mappedComp]	* (float)mappedSign;
	}

	DE_ASSERT(coordC[2] != 0.0f);
	coordC[2] = de::abs(coordC[2]);

	for (int compNdx = 0; compNdx < 2; ++compNdx)
	{
		coordFace[compNdx] = 0.5f * coordC[compNdx] / de::abs(coordC[2]) + 0.5f;

		dPdxFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdx[compNdx] - coordC[compNdx] * dPcdx[2]) / (coordC[2] * coordC[2]);
		dPdyFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdy[compNdx] - coordC[compNdx] * dPcdy[2]) / (coordC[2] * coordC[2]);
	}
}